

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB_STL_utils.cpp
# Opt level: O1

void __thiscall
amrex::STLtools::updateIntercept
          (STLtools *this,Array<Array4<Real>,_3> *inter_arr,
          Array<Array4<const_EB2::Type_t>,_3> *type_arr,Array4<const_double> *lst,Geometry *geom)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  double *pdVar18;
  long lVar19;
  double *pdVar20;
  long lVar21;
  long lVar22;
  uint *puVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  double *pdVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  bool bVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  int local_bc;
  
  dVar1 = (geom->super_CoordSys).dx[0];
  dVar2 = (geom->super_CoordSys).dx[1];
  dVar3 = (geom->super_CoordSys).dx[2];
  dVar4 = (geom->prob_domain).xlo[0];
  dVar5 = (geom->prob_domain).xlo[1];
  dVar6 = (geom->prob_domain).xlo[2];
  pdVar18 = lst->p;
  iVar9 = (lst->begin).x;
  lVar34 = (long)(lst->begin).y;
  lVar33 = lst->jstride * 8;
  lVar30 = lst->kstride * 8;
  lVar26 = -(long)(lst->begin).z;
  lVar39 = 0;
  do {
    local_bc = inter_arr->_M_elems[lVar39].begin.z;
    iVar10 = inter_arr->_M_elems[lVar39].end.z;
    if (local_bc < iVar10) {
      lVar42 = (long)local_bc;
      iVar11 = inter_arr->_M_elems[lVar39].end.x;
      iVar12 = inter_arr->_M_elems[lVar39].end.y;
      lVar19 = type_arr->_M_elems[lVar39].kstride;
      iVar13 = type_arr->_M_elems[lVar39].begin.z;
      pdVar20 = inter_arr->_M_elems[lVar39].p;
      iVar14 = type_arr->_M_elems[lVar39].begin.y;
      iVar15 = inter_arr->_M_elems[lVar39].begin.y;
      lVar40 = (long)iVar15;
      iVar16 = inter_arr->_M_elems[lVar39].begin.x;
      lVar31 = (long)iVar16;
      lVar41 = type_arr->_M_elems[lVar39].jstride * 4;
      lVar21 = inter_arr->_M_elems[lVar39].jstride;
      iVar17 = type_arr->_M_elems[lVar39].begin.x;
      lVar22 = inter_arr->_M_elems[lVar39].kstride;
      lVar25 = (lVar40 - lVar34) * lVar33 + lVar31 * 8 + (long)iVar9 * -8;
      puVar23 = type_arr->_M_elems[lVar39].p;
      iVar24 = local_bc;
      do {
        local_bc = local_bc + 1;
        if (iVar15 < iVar12) {
          lVar37 = (long)iVar24;
          lVar35 = (lVar26 + lVar37) * lVar30;
          lVar27 = (long)pdVar18 + lVar35 + lVar25;
          lVar36 = (long)pdVar18 +
                   lVar35 + ((1 - lVar34) + lVar40) * lVar33 + lVar31 * 8 + (long)iVar9 * -8;
          lVar32 = (long)pdVar18 + (local_bc + lVar26) * lVar30 + lVar25;
          pdVar28 = (double *)((lVar37 - lVar42) * lVar22 * 8 + (long)pdVar20);
          lVar37 = (long)puVar23 +
                   (lVar37 - iVar13) * lVar19 * 4 +
                   (lVar40 - iVar14) * lVar41 + lVar31 * 4 + (long)iVar17 * -4;
          dVar44 = (double)iVar24 * dVar3 + dVar6;
          dVar45 = (double)(iVar24 + 1) * dVar3 + dVar6;
          lVar35 = lVar40;
          do {
            if (iVar16 < iVar11) {
              dVar46 = (double)(int)lVar35 * dVar2 + dVar5;
              dVar47 = (double)((int)lVar35 + 1) * dVar2 + dVar5;
              lVar38 = 0;
              do {
                if (*(int *)(lVar37 + lVar38 * 4) == 2) {
                  dVar7 = pdVar28[lVar38];
                  if ((int)lVar39 == 1) {
                    dVar8 = *(double *)(lVar27 + lVar38 * 8);
                    dVar48 = dVar46;
                    if (((dVar8 != 0.0) || (NAN(dVar8))) && (dVar8 <= 0.0 || !NAN(dVar7))) {
                      dVar8 = *(double *)(lVar36 + lVar38 * 8);
                      dVar48 = dVar47;
                      if ((dVar8 != 0.0) || (NAN(dVar8))) {
                        bVar43 = !NAN(dVar7) || dVar8 <= 0.0;
LAB_007672ef:
                        if (bVar43) goto LAB_00767314;
                      }
                    }
                  }
                  else if ((int)lVar39 == 0) {
                    dVar8 = *(double *)(lVar27 + lVar38 * 8);
                    if (((dVar8 == 0.0) && (!NAN(dVar8))) || (0.0 < dVar8 && NAN(dVar7))) {
                      iVar29 = iVar16 + (int)lVar38;
                    }
                    else {
                      dVar8 = *(double *)(lVar27 + 8 + lVar38 * 8);
                      if (((dVar8 != 0.0) || (NAN(dVar8))) && (!NAN(dVar7) || dVar8 <= 0.0))
                      goto LAB_00767314;
                      iVar29 = iVar16 + (int)lVar38 + 1;
                    }
                    dVar48 = (double)iVar29 * dVar1 + dVar4;
                  }
                  else {
                    dVar8 = *(double *)(lVar27 + lVar38 * 8);
                    dVar48 = dVar44;
                    if (((dVar8 != 0.0) || (NAN(dVar8))) && (dVar8 <= 0.0 || !NAN(dVar7))) {
                      dVar8 = *(double *)(lVar32 + lVar38 * 8);
                      dVar48 = dVar45;
                      if ((dVar8 != 0.0) || (NAN(dVar8))) {
                        bVar43 = !NAN(dVar7) || dVar8 <= 0.0;
                        goto LAB_007672ef;
                      }
                    }
                  }
                  pdVar28[lVar38] = dVar48;
                }
LAB_00767314:
                lVar38 = lVar38 + 1;
              } while ((iVar16 - iVar11) + (int)lVar38 != 0);
            }
            lVar35 = lVar35 + 1;
            lVar27 = lVar27 + lVar33;
            lVar36 = lVar36 + lVar33;
            lVar32 = lVar32 + lVar33;
            pdVar28 = pdVar28 + lVar21;
            lVar37 = lVar37 + lVar41;
          } while (iVar12 != (int)lVar35);
        }
        bVar43 = iVar24 != iVar10 + -1;
        iVar24 = iVar24 + 1;
      } while (bVar43);
    }
    lVar39 = lVar39 + 1;
    if (lVar39 == 3) {
      return;
    }
  } while( true );
}

Assistant:

void
STLtools::updateIntercept (Array<Array4<Real>,AMREX_SPACEDIM> const& inter_arr,
                           Array<Array4<EB2::Type_t const>,AMREX_SPACEDIM> const& type_arr,
                           Array4<Real const> const& lst, Geometry const& geom) const
{
    auto const& dx = geom.CellSizeArray();
    auto const& problo = geom.ProbLoArray();
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        Array4<Real> const& inter = inter_arr[idim];
        Array4<EB2::Type_t const> const& type = type_arr[idim];
        const Box bx{inter};
        amrex::ParallelFor(bx, [=] AMREX_GPU_DEVICE (int i, int j, int k)
        {
            if (type(i,j,k) == EB2::Type::irregular) {
                bool is_nan = amrex::isnan(inter(i,j,k));
                if (idim == 0) {
                    if (lst(i,j,k) == Real(0.0) ||
                        (lst(i,j,k) > Real(0.0) && is_nan))
                    {
                        // interp might still be quiet_nan because lst that
                        // was set to zero has been changed by FillBoundary
                        // at periodic bounadries.
                        inter(i,j,k) = problo[0] + i*dx[0];
                    }
                    else if (lst(i+1,j,k) == Real(0.0) ||
                             (lst(i+1,j,k) > Real(0.0) && is_nan))
                    {
                        inter(i,j,k) = problo[0] + (i+1)*dx[0];
                    }
                } else if (idim == 1) {
                    if (lst(i,j,k) == Real(0.0) ||
                        (lst(i,j,k) > Real(0.0) && is_nan))
                    {
                        inter(i,j,k) = problo[1] + j*dx[1];
                    }
                    else if (lst(i,j+1,k) == Real(0.0) ||
                             (lst(i,j+1,k) > Real(0.0) && is_nan))
                    {
                        inter(i,j,k) = problo[1] + (j+1)*dx[1];
                    }
                } else {
                    if (lst(i,j,k) == Real(0.0) ||
                        (lst(i,j,k) > Real(0.0) && is_nan))
                    {
                        inter(i,j,k) = problo[2] + k*dx[2];
                        }
                    else if (lst(i,j,k+1) == Real(0.0) ||
                             (lst(i,j,k+1) > Real(0.0) && is_nan))
                    {
                        inter(i,j,k) = problo[2] + (k+1)*dx[2];
                    }
                }
            }
        });
    }
}